

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorGraph.hpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkValidatorGraph::insertNode(NeuralNetworkValidatorGraph *this,LayerNode *node)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  *this_00;
  pointer pbVar1;
  mapped_type pLVar2;
  iterator iVar3;
  mapped_type *ppLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_1;
  LayerNode *producingNode;
  mapped_type local_48;
  mapped_type local_40;
  NeuralNetworkValidatorGraph *local_38;
  
  pbVar1 = (node->inputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->blobNameToProducingNode;
  local_48 = node;
  local_38 = this;
  for (pbVar5 = (node->inputNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
            ::find(&this_00->_M_t,pbVar5);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->blobNameToProducingNode)._M_t._M_impl.super__Rb_tree_header) {
      ppLVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
                ::at(this_00,pbVar5);
      local_40 = *ppLVar4;
      std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::push_back
                (&local_48->parents,&local_40);
      std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::push_back
                (&local_40->children,&local_48);
    }
  }
  pbVar1 = (local_48->outputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (local_48->outputNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pLVar2 = local_48, pbVar5 != pbVar1;
      pbVar5 = pbVar5 + 1) {
    ppLVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
              ::operator[](this_00,pbVar5);
    *ppLVar4 = pLVar2;
  }
  ppLVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
            ::operator[](&local_38->nodeNameToNode,&local_48->name);
  *ppLVar4 = pLVar2;
  return;
}

Assistant:

void insertNode(LayerNode *node)
    {
        for (const auto& name: node->inputNames) {
            if (blobNameToProducingNode.find(name) != blobNameToProducingNode.end()) {
                LayerNode *producingNode = blobNameToProducingNode.at(name);
                node->parents.push_back(producingNode);
                producingNode->children.push_back(node);
            }
        }
        for (const auto& name: node->outputNames) {
            blobNameToProducingNode[name] = node;
        }
        nodeNameToNode[node->name] = node;
    }